

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O2

void __thiscall QSplitterPrivate::recalc(QSplitterPrivate *this,bool update)

{
  undefined1 *puVar1;
  uint uVar2;
  Orientation OVar3;
  QWidget *this_00;
  QSplitterLayoutStruct *pQVar4;
  QSplitterHandle *pQVar5;
  ulong uVar6;
  int iVar7;
  Representation RVar8;
  ulong uVar9;
  undefined8 uVar10;
  QSize QVar11;
  QSize QVar12;
  QSplitter *pQVar13;
  int i;
  int iVar14;
  ulong uVar15;
  QWidget *w;
  ulong uVar16;
  int iVar17;
  byte bVar18;
  byte bVar19;
  int iVar20;
  bool bVar21;
  int local_5c;
  
  this_00 = *(QWidget **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x8;
  uVar2 = (uint)(this->list).d.size;
  uVar15 = 0;
  bVar21 = uVar2 != 0;
  uVar16 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar16 = uVar15;
  }
  bVar19 = 1;
  for (; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    pQVar4 = (this->list).d.ptr[uVar15];
    uVar2 = pQVar4->widget->data->widget_attributes;
    if (((uVar2 >> 0x10 & 1) == 0) && (bVar21 != false)) {
      bVar21 = (bool)(bVar21 & -(pQVar4->field_0x14 & 1));
    }
    bVar18 = (byte)(uVar2 >> 0x10) & 1;
    QWidget::setHidden(&pQVar4->handle->super_QWidget,(bool)(bVar19 | bVar18));
    bVar19 = bVar18 & bVar19;
  }
  if (bVar21 != false) {
    uVar15 = 0;
    do {
      if (uVar16 == uVar15) goto LAB_00447713;
      pQVar4 = (this->list).d.ptr[uVar15];
      uVar15 = uVar15 + 1;
    } while ((pQVar4->widget->data->widget_attributes & 0x10000) != 0);
    puVar1 = &pQVar4->field_0x14;
    *puVar1 = *puVar1 & 0xfe;
  }
LAB_00447713:
  iVar7 = QFrame::frameWidth((QFrame *)this_00);
  iVar7 = iVar7 * 2;
  bVar21 = true;
  local_5c = 0xffffff;
  iVar17 = iVar7;
  iVar20 = iVar7;
  for (uVar15 = 0; uVar16 != uVar15; uVar15 = uVar15 + 1) {
    pQVar4 = (this->list).d.ptr[uVar15];
    w = pQVar4->widget;
    if ((w->data->widget_attributes & 0x10000) == 0) {
      pQVar5 = pQVar4->handle;
      if ((((pQVar5->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
        OVar3 = this->orient;
        uVar9 = (**(code **)(*(long *)&pQVar5->super_QWidget + 0x70))(pQVar5);
        uVar6 = uVar9 >> 0x20;
        if (OVar3 == Horizontal) {
          uVar6 = uVar9;
        }
        iVar20 = iVar20 + (int)uVar6;
        OVar3 = this->orient;
        uVar10 = (**(code **)(*(long *)&pQVar4->handle->super_QWidget + 0x70))();
        iVar14 = (int)((ulong)uVar10 >> 0x20);
        if (OVar3 == Horizontal) {
          iVar14 = (int)uVar10;
        }
        iVar17 = iVar17 + iVar14;
        w = pQVar4->widget;
      }
      QVar11 = qSmartMinSize(w);
      RVar8 = QVar11.ht.m_i;
      if (this->orient == Horizontal) {
        RVar8 = QVar11.wd.m_i;
      }
      iVar20 = RVar8.m_i + iVar20;
      QVar12 = qSmartMaxSize(pQVar4->widget,(Alignment)0x0);
      RVar8 = QVar12.ht.m_i;
      if (this->orient == Horizontal) {
        RVar8 = QVar12.wd.m_i;
      }
      iVar17 = RVar8.m_i + iVar17;
      QVar12 = (QSize)((ulong)QVar11 >> 0x20);
      if (this->orient == Vertical) {
        QVar12 = QVar11;
      }
      RVar8.m_i = QVar12.wd.m_i.m_i;
      if (QVar12.wd.m_i.m_i < iVar7) {
        RVar8.m_i = iVar7;
      }
      iVar7 = RVar8.m_i;
      QVar11 = qSmartMaxSize(pQVar4->widget,(Alignment)0x0);
      RVar8 = QVar11.ht.m_i;
      if (this->orient == Vertical) {
        RVar8 = QVar11.wd.m_i;
      }
      if (RVar8.m_i < 1) {
        bVar21 = false;
      }
      else {
        if (local_5c < RVar8.m_i) {
          RVar8.m_i = local_5c;
        }
        bVar21 = false;
        local_5c = RVar8.m_i;
      }
    }
  }
  if (bVar21) {
    pQVar13 = QtPrivate::qobject_cast_helper<QSplitter*,QObject>
                        (*(QObject **)&(this->super_QFramePrivate).super_QWidgetPrivate.field_0x10);
    if (pQVar13 != (QSplitter *)0x0) {
      local_5c = 0;
    }
    iVar14 = 0xffffff;
    if (pQVar13 != (QSplitter *)0x0) {
      iVar14 = 0;
    }
  }
  else {
    iVar14 = 0xffffff;
    if (iVar17 < 0xffffff) {
      iVar14 = iVar17;
    }
  }
  if (local_5c <= iVar7) {
    local_5c = iVar7;
  }
  if (update) {
    if (this->orient == Horizontal) {
      QWidget::setMaximumSize(this_00,iVar14,local_5c);
      bVar19 = (byte)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i;
      iVar17 = iVar20;
    }
    else {
      QWidget::setMaximumSize(this_00,local_5c,iVar14);
      bVar19 = (byte)(this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                     super_QFlagsStorage<Qt::WindowType>.i;
      iVar17 = iVar7;
      iVar7 = iVar20;
    }
    if ((bVar19 & 1) != 0) {
      QWidget::setMinimumSize(this_00,iVar17,iVar7);
    }
    doResize(this);
    QWidget::updateGeometry(this_00);
    return;
  }
  this->field_0x2a5 = 1;
  return;
}

Assistant:

void QSplitterPrivate::recalc(bool update)
{
    Q_Q(QSplitter);
    int n = list.size();
    /*
      Splitter handles before the first visible widget or right
      before a hidden widget must be hidden.
    */
    bool first = true;
    bool allInvisible = n != 0;
    for (int i = 0; i < n ; ++i) {
        QSplitterLayoutStruct *s = list.at(i);
        bool widgetHidden = s->widget->isHidden();
        if (allInvisible && !widgetHidden && !s->collapsed)
            allInvisible = false;
        s->handle->setHidden(first || widgetHidden);
        if (!widgetHidden)
            first = false;
    }

    if (allInvisible)
        for (int i = 0; i < n ; ++i) {
            QSplitterLayoutStruct *s = list.at(i);
            if (!s->widget->isHidden()) {
                s->collapsed = false;
                break;
            }
        }

    int fi = 2 * q->frameWidth();
    int maxl = fi;
    int minl = fi;
    int maxt = QWIDGETSIZE_MAX;
    int mint = fi;
    /*
      calculate min/max sizes for the whole splitter
    */
    bool empty = true;
    for (int j = 0; j < n; j++) {
        QSplitterLayoutStruct *s = list.at(j);

        if (!s->widget->isHidden()) {
            empty = false;
            if (!s->handle->isHidden()) {
                minl += s->getHandleSize(orient);
                maxl += s->getHandleSize(orient);
            }

            QSize minS = qSmartMinSize(s->widget);
            minl += pick(minS);
            maxl += pick(qSmartMaxSize(s->widget));
            mint = qMax(mint, trans(minS));
            int tm = trans(qSmartMaxSize(s->widget));
            if (tm > 0)
                maxt = qMin(maxt, tm);
        }
    }

    if (empty) {
        if (qobject_cast<QSplitter *>(parent)) {
            // nested splitters; be nice
            maxl = maxt = 0;
        } else {
            // QSplitter with no children yet
            maxl = QWIDGETSIZE_MAX;
        }
    } else {
        maxl = qMin<int>(maxl, QWIDGETSIZE_MAX);
    }
    if (maxt < mint)
        maxt = mint;

    if (update) {
        if (orient == Qt::Horizontal) {
            q->setMaximumSize(maxl, maxt);
            if (q->isWindow())
                q->setMinimumSize(minl,mint);
        } else {
            q->setMaximumSize(maxt, maxl);
            if (q->isWindow())
                q->setMinimumSize(mint,minl);
        }
        doResize();
        q->updateGeometry();
    } else {
        firstShow = true;
    }
}